

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O0

void __thiscall blockencodings_tests::SimpleRoundTripTest::test_method(SimpleRoundTripTest *this)

{
  long lVar1;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  bool bVar2;
  unsigned_long uVar3;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffef38;
  PartiallyDownloadedBlock *in_stack_ffffffffffffef40;
  char *in_stack_ffffffffffffef48;
  PartiallyDownloadedBlock *in_stack_ffffffffffffef50;
  undefined4 in_stack_ffffffffffffef58;
  int in_stack_ffffffffffffef5c;
  CTxMemPool *in_stack_ffffffffffffef60;
  undefined4 in_stack_ffffffffffffef68;
  int in_stack_ffffffffffffef6c;
  CTxMemPoolEntry *in_stack_ffffffffffffef70;
  CTxMemPool *in_stack_ffffffffffffef78;
  CTxMemPool *in_stack_ffffffffffffef80;
  CTransactionRef *in_stack_ffffffffffffef88;
  undefined7 in_stack_ffffffffffffef90;
  undefined1 in_stack_ffffffffffffef97;
  CBlock *in_stack_ffffffffffffef98;
  undefined7 in_stack_ffffffffffffefa8;
  undefined1 in_stack_ffffffffffffefaf;
  CBlock *in_stack_ffffffffffffefb0;
  CBlockHeaderAndShortTxIDs *in_stack_ffffffffffffefb8;
  undefined8 in_stack_ffffffffffffefe0;
  MemPoolRemovalReason reason;
  CBlock *pCVar4;
  CTransaction *in_stack_ffffffffffffefe8;
  CBlock *pCVar5;
  CTxMemPool *in_stack_ffffffffffffeff0;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffff038;
  uint256 *vtx_missing;
  CBlock *in_stack_fffffffffffff040;
  CBlock *block_00;
  PartiallyDownloadedBlock *in_stack_fffffffffffff048;
  PartiallyDownloadedBlock *this_00;
  PartiallyDownloadedBlock *pPVar6;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffff120;
  undefined7 in_stack_fffffffffffff128;
  undefined1 in_stack_fffffffffffff12f;
  PartiallyDownloadedBlock *in_stack_fffffffffffff130;
  size_t poolSize;
  CTxMemPool *pool;
  SimpleRoundTripTest *this_local;
  const_string local_dd0 [2];
  lazy_ostream local_db0 [2];
  assertion_result local_d90 [2];
  undefined1 local_d58 [16];
  undefined1 local_d48 [64];
  undefined1 local_d08 [16];
  undefined1 local_cf8 [64];
  const_string local_cb8 [2];
  lazy_ostream local_c98 [4];
  assertion_result local_c58 [2];
  const_string local_c20 [2];
  lazy_ostream local_c00 [2];
  assertion_result local_be0 [2];
  bool mutated;
  const_string local_b88 [2];
  lazy_ostream local_b68 [2];
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  assertion_result local_b30 [2];
  undefined1 local_af8 [96];
  undefined1 local_a98 [144];
  lazy_ostream local_a08 [2];
  assertion_result local_9e8 [2];
  const_string local_9b0 [2];
  lazy_ostream local_990 [2];
  assertion_result local_970 [2];
  const_string local_938 [2];
  lazy_ostream local_918 [2];
  assertion_result local_8f8 [2];
  const_string local_8c0 [2];
  lazy_ostream local_8a0 [2];
  assertion_result local_880 [2];
  DataStream stream;
  undefined1 local_828 [112];
  TestMemPoolEntryHelper entry;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined1 local_738 [160];
  undefined1 local_698 [32];
  undefined1 local_678 [16];
  CBlock block3;
  undefined1 local_5d8 [16];
  PartiallyDownloadedBlock tmp_1;
  PartiallyDownloadedBlock tmp;
  CBlock block2;
  PartiallyDownloadedBlock partialBlock;
  CBlockHeaderAndShortTxIDs shortIDs2;
  CBlockHeaderAndShortTxIDs shortIDs;
  CBlock block;
  FastRandomContext rand_ctx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffef78,
             (char *)in_stack_ffffffffffffef70,in_stack_ffffffffffffef6c,
             (char *)in_stack_ffffffffffffef60,
             (char *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffef48);
  TestMemPoolEntryHelper::TestMemPoolEntryHelper
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffef38);
  uint256::uint256((uint256 *)in_stack_ffffffffffffef38,'\0');
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58),
             (uint256 *)in_stack_ffffffffffffef50);
  BuildBlockTestCase((FastRandomContext *)in_stack_ffffffffffffeff0);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffef38);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffef78,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffef70,
             (char *)CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
             (char *)in_stack_ffffffffffffef60,in_stack_ffffffffffffef5c,
             SUB41((uint)in_stack_ffffffffffffef58 >> 0x18,0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffef38);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffef78,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffef70,
             (char *)CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
             (char *)in_stack_ffffffffffffef60,in_stack_ffffffffffffef5c,
             SUB41((uint)in_stack_ffffffffffffef58 >> 0x18,0));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffef48,(size_type)in_stack_ffffffffffffef40);
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90)
             ,in_stack_ffffffffffffef88);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffef78,in_stack_ffffffffffffef70);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffef38);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef78,
               (const_string *)in_stack_ffffffffffffef70,
               CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
               (const_string *)in_stack_ffffffffffffef60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef40,(char (*) [1])in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffef48,(size_type)in_stack_ffffffffffffef40);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffef38);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef38);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffef38);
    CTxMemPool::get(in_stack_ffffffffffffef80,(uint256 *)in_stack_ffffffffffffef78);
    local_828._24_8_ =
         std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::use_count
                   ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                    in_stack_ffffffffffffef38);
    local_828._0_8_ = &DAT_00000004;
    in_stack_ffffffffffffef48 = "SHARED_TX_OFFSET + 0";
    in_stack_ffffffffffffef40 = (PartiallyDownloadedBlock *)local_828;
    in_stack_ffffffffffffef38 = "pool.get(block.vtx[2]->GetHash()).use_count()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_828 + 0x30,local_828 + 0x20,0x47,1,2,local_828 + 0x18);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef38);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FastRandomContext::rand64((FastRandomContext *)in_stack_ffffffffffffef50);
  CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs
            (in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0,
             CONCAT17(in_stack_ffffffffffffefaf,in_stack_ffffffffffffefa8));
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stream.m_read_pos = 0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DataStream::DataStream((DataStream *)in_stack_ffffffffffffef38);
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffef48,
             (CBlockHeaderAndShortTxIDs *)in_stack_ffffffffffffef40);
  CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs
            ((CBlockHeaderAndShortTxIDs *)
             CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68));
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffef48,
             (CBlockHeaderAndShortTxIDs *)in_stack_ffffffffffffef40);
  PartiallyDownloadedBlock::PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)
             CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),in_stack_ffffffffffffef60
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef78,
               (const_string *)in_stack_ffffffffffffef70,
               CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
               (const_string *)in_stack_ffffffffffffef60);
    PartiallyDownloadedBlock::InitData
              (in_stack_fffffffffffff130,
               (CBlockHeaderAndShortTxIDs *)
               CONCAT17(in_stack_fffffffffffff12f,in_stack_fffffffffffff128),
               in_stack_fffffffffffff120);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef48,
               SUB81((ulong)in_stack_ffffffffffffef40 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef40,
               (basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    in_stack_ffffffffffffef38 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_880,local_8a0,local_8c0,0x54,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef78,
               (const_string *)in_stack_ffffffffffffef70,
               CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
               (const_string *)in_stack_ffffffffffffef60);
    PartiallyDownloadedBlock::IsTxAvailable
              (in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef48,
               SUB81((ulong)in_stack_ffffffffffffef40 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef40,
               (basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    in_stack_ffffffffffffef38 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8f8,local_918,local_938,0x55,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef78,
               (const_string *)in_stack_ffffffffffffef70,
               CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
               (const_string *)in_stack_ffffffffffffef60);
    PartiallyDownloadedBlock::IsTxAvailable
              (in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef48,
               SUB81((ulong)in_stack_ffffffffffffef40 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef40,
               (basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    in_stack_ffffffffffffef38 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_970,local_990,local_9b0,0x56,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef78,
               (const_string *)in_stack_ffffffffffffef70,
               CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
               (const_string *)in_stack_ffffffffffffef60);
    PartiallyDownloadedBlock::IsTxAvailable
              (in_stack_ffffffffffffef50,(size_t)in_stack_ffffffffffffef48);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef48,
               SUB81((ulong)in_stack_ffffffffffffef40 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef40,
               (basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    in_stack_ffffffffffffef38 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9e8,local_a08,(const_string *)(local_a98 + 0x70),0x57,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef78,
               (const_string *)in_stack_ffffffffffffef70,
               CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
               (const_string *)in_stack_ffffffffffffef60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef40,(char (*) [1])in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffef48,(size_type)in_stack_ffffffffffffef40);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffef38);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffef38);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffef38);
    CTxMemPool::get(in_stack_ffffffffffffef80,(uint256 *)in_stack_ffffffffffffef78);
    local_a98._24_8_ =
         std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::use_count
                   ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                    in_stack_ffffffffffffef38);
    local_a98._0_8_ = (pointer)0x5;
    in_stack_ffffffffffffef48 = "SHARED_TX_OFFSET + 1";
    in_stack_ffffffffffffef40 = (PartiallyDownloadedBlock *)local_a98;
    in_stack_ffffffffffffef38 = "pool.get(block.vtx[2]->GetHash()).use_count()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_a98 + 0x30,local_a98 + 0x20,0x59,1,2,local_a98 + 0x18);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef38);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    reason = (MemPoolRemovalReason)((ulong)in_stack_ffffffffffffefe0 >> 0x20);
  } while (bVar2);
  uVar3 = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffef48);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffef48,(size_type)in_stack_ffffffffffffef40);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffef48);
  CTxMemPool::removeRecursive(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,reason);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef78,
               (const_string *)in_stack_ffffffffffffef70,
               CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
               (const_string *)in_stack_ffffffffffffef60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef40,(char (*) [1])in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    local_af8._8_8_ = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffef48);
    local_af8._0_8_ = uVar3 - 1;
    in_stack_ffffffffffffef48 = "poolSize - 1";
    in_stack_ffffffffffffef40 = (PartiallyDownloadedBlock *)local_af8;
    in_stack_ffffffffffffef38 = "pool.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_af8 + 0x20,local_af8 + 0x10,0x5d,1,2,local_af8 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CBlock::CBlock((CBlock *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
  PartiallyDownloadedBlock::PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)
             CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58),in_stack_ffffffffffffef50
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef78,
               (const_string *)in_stack_ffffffffffffef70,
               CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
               (const_string *)in_stack_ffffffffffffef60);
    local_b48 = 0;
    uStack_b40 = 0;
    local_b38 = 0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_ffffffffffffef38);
    PartiallyDownloadedBlock::FillBlock
              (in_stack_fffffffffffff048,in_stack_fffffffffffff040,in_stack_fffffffffffff038);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef48,
               SUB81((ulong)in_stack_ffffffffffffef40 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef40,
               (basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    in_stack_ffffffffffffef38 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b30,local_b68,local_b88,0x62,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef38);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)in_stack_ffffffffffffef48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PartiallyDownloadedBlock::operator=
            ((PartiallyDownloadedBlock *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  PartiallyDownloadedBlock::~PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)in_stack_ffffffffffffef38);
  PartiallyDownloadedBlock::PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)
             CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58),in_stack_ffffffffffffef50
            );
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffef48,(size_type)in_stack_ffffffffffffef40);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef38,
             (shared_ptr<const_CTransaction> *)0x42e31b);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffef38);
  __l._M_len = (size_type)in_stack_ffffffffffffef88;
  __l._M_array = (iterator)in_stack_ffffffffffffef80;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_ffffffffffffef78,__l,(allocator_type *)in_stack_ffffffffffffef70);
  PartiallyDownloadedBlock::FillBlock
            (in_stack_fffffffffffff048,in_stack_fffffffffffff040,in_stack_fffffffffffff038);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffef48);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffef38);
  pPVar6 = (PartiallyDownloadedBlock *)local_5d8;
  this_00 = &tmp_1;
  do {
    this_00 = (PartiallyDownloadedBlock *)
              &this_00[-1].m_check_block_mock.super__Function_base._M_manager;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef38);
  } while (this_00 != pPVar6);
  PartiallyDownloadedBlock::operator=
            ((PartiallyDownloadedBlock *)in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  PartiallyDownloadedBlock::~PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)in_stack_ffffffffffffef38);
  do {
    block_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef78,
               (const_string *)in_stack_ffffffffffffef70,
               CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
               (const_string *)in_stack_ffffffffffffef60);
    vtx_missing = &block.super_CBlockHeader.hashMerkleRoot;
    BlockMerkleRoot(in_stack_ffffffffffffef98,
                    (bool *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    ::operator!=((base_blob<256U> *)in_stack_ffffffffffffef48,
                 (base_blob<256U> *)in_stack_ffffffffffffef40);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef48,
               SUB81((ulong)in_stack_ffffffffffffef40 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef40,
               (basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    in_stack_ffffffffffffef38 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_be0,local_c00,local_c20,0x6d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CBlock::CBlock((CBlock *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef78,
               (const_string *)in_stack_ffffffffffffef70,
               CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
               (const_string *)in_stack_ffffffffffffef60);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffef48,(size_type)in_stack_ffffffffffffef40);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef38,
               (shared_ptr<const_CTransaction> *)0x42e657);
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffef38);
    __l_00._M_len = (size_type)in_stack_ffffffffffffef88;
    __l_00._M_array = (iterator)in_stack_ffffffffffffef80;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_ffffffffffffef78,__l_00,(allocator_type *)in_stack_ffffffffffffef70);
    PartiallyDownloadedBlock::FillBlock
              (this_00,block_00,
               (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)vtx_missing);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef48,
               SUB81((ulong)in_stack_ffffffffffffef40 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef40,
               (basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    in_stack_ffffffffffffef38 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c58,local_c98,local_cb8,0x70,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef38);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)in_stack_ffffffffffffef48);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffef38);
    pCVar5 = (CBlock *)local_678;
    pCVar4 = &block3;
    do {
      pCVar4 = (CBlock *)
               &pCVar4[-1].vtx.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffef38);
    } while (pCVar4 != pCVar5);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef78,
               (const_string *)in_stack_ffffffffffffef70,
               CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
               (const_string *)in_stack_ffffffffffffef60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef40,(char (*) [1])in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    CBlockHeader::GetHash
              ((CBlockHeader *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffef40);
    CBlockHeader::GetHash
              ((CBlockHeader *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58));
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffef40);
    in_stack_ffffffffffffef48 = "block3.GetHash().ToString()";
    in_stack_ffffffffffffef40 = (PartiallyDownloadedBlock *)(local_738 + 0x60);
    in_stack_ffffffffffffef38 = "block.GetHash().ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_cf8,local_d08,0x71,1,2,local_698);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef38);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef78,
               (const_string *)in_stack_ffffffffffffef70,
               CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
               (const_string *)in_stack_ffffffffffffef60);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef40,(char (*) [1])in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffef40);
    BlockMerkleRoot(in_stack_ffffffffffffef98,
                    (bool *)CONCAT17(in_stack_ffffffffffffef97,in_stack_ffffffffffffef90));
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffef40);
    in_stack_ffffffffffffef48 = "BlockMerkleRoot(block3, &mutated).ToString()";
    in_stack_ffffffffffffef40 = (PartiallyDownloadedBlock *)local_738;
    in_stack_ffffffffffffef38 = "block.hashMerkleRoot.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_d48,local_d58,0x72,1,2,local_738 + 0x20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffef38);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffef38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffef78,
               (const_string *)in_stack_ffffffffffffef70,
               CONCAT44(in_stack_ffffffffffffef6c,in_stack_ffffffffffffef68),
               (const_string *)in_stack_ffffffffffffef60);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffef48,
               SUB81((ulong)in_stack_ffffffffffffef40 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef40,
               (basic_cstring<const_char> *)in_stack_ffffffffffffef38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef48,
               (pointer)in_stack_ffffffffffffef40,(unsigned_long)in_stack_ffffffffffffef38);
    in_stack_ffffffffffffef38 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d90,local_db0,local_dd0,0x73,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffef38);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CBlock::~CBlock((CBlock *)in_stack_ffffffffffffef38);
  CBlock::~CBlock((CBlock *)in_stack_ffffffffffffef38);
  PartiallyDownloadedBlock::~PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)in_stack_ffffffffffffef38);
  CBlockHeaderAndShortTxIDs::~CBlockHeaderAndShortTxIDs
            ((CBlockHeaderAndShortTxIDs *)in_stack_ffffffffffffef38);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffef38);
  CBlockHeaderAndShortTxIDs::~CBlockHeaderAndShortTxIDs
            ((CBlockHeaderAndShortTxIDs *)in_stack_ffffffffffffef38);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffef38);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffef38);
  CBlock::~CBlock((CBlock *)in_stack_ffffffffffffef38);
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffef38);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SimpleRoundTripTest)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    TestMemPoolEntryHelper entry;
    auto rand_ctx(FastRandomContext(uint256{42}));
    CBlock block(BuildBlockTestCase(rand_ctx));

    LOCK2(cs_main, pool.cs);
    pool.addUnchecked(entry.FromTx(block.vtx[2]));
    BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 0);

    // Do a simple ShortTxIDs RT
    {
        CBlockHeaderAndShortTxIDs shortIDs{block, rand_ctx.rand64()};

        DataStream stream{};
        stream << shortIDs;

        CBlockHeaderAndShortTxIDs shortIDs2;
        stream >> shortIDs2;

        PartiallyDownloadedBlock partialBlock(&pool);
        BOOST_CHECK(partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK);
        BOOST_CHECK( partialBlock.IsTxAvailable(0));
        BOOST_CHECK(!partialBlock.IsTxAvailable(1));
        BOOST_CHECK( partialBlock.IsTxAvailable(2));

        BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 1);

        size_t poolSize = pool.size();
        pool.removeRecursive(*block.vtx[2], MemPoolRemovalReason::REPLACED);
        BOOST_CHECK_EQUAL(pool.size(), poolSize - 1);

        CBlock block2;
        {
            PartiallyDownloadedBlock tmp = partialBlock;
            BOOST_CHECK(partialBlock.FillBlock(block2, {}) == READ_STATUS_INVALID); // No transactions
            partialBlock = tmp;
        }

        // Wrong transaction
        {
            PartiallyDownloadedBlock tmp = partialBlock;
            partialBlock.FillBlock(block2, {block.vtx[2]}); // Current implementation doesn't check txn here, but don't require that
            partialBlock = tmp;
        }
        bool mutated;
        BOOST_CHECK(block.hashMerkleRoot != BlockMerkleRoot(block2, &mutated));

        CBlock block3;
        BOOST_CHECK(partialBlock.FillBlock(block3, {block.vtx[1]}) == READ_STATUS_OK);
        BOOST_CHECK_EQUAL(block.GetHash().ToString(), block3.GetHash().ToString());
        BOOST_CHECK_EQUAL(block.hashMerkleRoot.ToString(), BlockMerkleRoot(block3, &mutated).ToString());
        BOOST_CHECK(!mutated);
    }
}